

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~Array
          (Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  dispose(this);
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }